

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_sizeof_CCtx(ZSTD_CCtx *cctx)

{
  ZSTD_CCtx *pZVar1;
  void *pvVar2;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  long lVar6;
  void *pvVar7;
  
  if (cctx == (ZSTD_CCtx *)0x0) {
    sVar3 = 0;
  }
  else {
    pZVar1 = (ZSTD_CCtx *)(cctx->workspace).workspace;
    pvVar2 = (cctx->workspace).workspaceEnd;
    pvVar7 = (cctx->localDict).dictBuffer;
    if (pvVar7 != (void *)0x0) {
      pvVar7 = (void *)(cctx->localDict).dictSize;
    }
    sVar3 = ZSTD_sizeof_CDict((cctx->localDict).cdict);
    sVar4 = ZSTDMT_sizeof_CCtx(cctx->mtctx);
    lVar6 = (long)pvVar2 - (long)pZVar1;
    lVar5 = lVar6 + 0x1478;
    if (pZVar1 == cctx) {
      lVar5 = lVar6;
    }
    sVar3 = lVar5 + sVar3 + sVar4 + (long)pvVar7;
  }
  return sVar3;
}

Assistant:

size_t ZSTD_sizeof_CCtx(const ZSTD_CCtx* cctx)
{
    if (cctx==NULL) return 0;   /* support sizeof on NULL */
    /* cctx may be in the workspace */
    return (cctx->workspace.workspace == cctx ? 0 : sizeof(*cctx))
           + ZSTD_cwksp_sizeof(&cctx->workspace)
           + ZSTD_sizeof_localDict(cctx->localDict)
           + ZSTD_sizeof_mtctx(cctx);
}